

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *filename)

{
  string *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  string *in_stack_00000138;
  LinkedReadsDatastore *in_stack_00000140;
  string local_48 [8];
  LinkedReadsDatastore *in_stack_ffffffffffffffc0;
  WorkSpace *in_stack_ffffffffffffffc8;
  LinkedReadsMapper *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string(in_RDI);
  LinkedReadsMapper::LinkedReadsMapper
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::string(in_RDI + 0xd0);
  std::__cxx11::string::string(in_RDI + 0xf0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c3c47);
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = in_RSI;
  std::__cxx11::string::string(local_48,in_RDX);
  load_index(in_stack_00000140,in_stack_00000138);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string filename) : ws(ws), mapper(ws, *this){
    load_index(filename);
}